

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

assetsys_error_t
assetsys_mount(assetsys_t *sys,char *path,char *zip_mem,size_t zip_mem_size,char *mount_as)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  mz_bool mVar4;
  mz_uint mVar5;
  char *pcVar6;
  size_t sVar7;
  assetsys_internal_mount_t *paVar8;
  unsigned_long_long uVar9;
  assetsys_internal_file_t *paVar10;
  assetsys_internal_folder_t *paVar11;
  int local_7c4;
  char *local_7c0;
  char *local_7b0;
  assetsys_internal_folder_t *as_dir_1;
  int j;
  int found;
  unsigned_long_long handle;
  char *dir_path;
  assetsys_internal_file_t *file;
  undefined1 local_778 [4];
  mz_bool result;
  mz_zip_archive_file_stat stat;
  assetsys_internal_file_t *new_files;
  int i_1;
  assetsys_internal_folder_t *as_dir;
  char filename [1024];
  assetsys_internal_folder_t *new_dirs;
  int i;
  int count;
  mz_bool status;
  assetsys_internal_folder_t *dir;
  assetsys_internal_mount_t *mount;
  assetsys_internal_mount_t *new_mounts;
  undefined1 local_d8 [4];
  int res;
  stat s;
  assetsys_internal_mount_type_t type;
  int mount_len;
  int len;
  char *mount_as_local;
  size_t zip_mem_size_local;
  char *zip_mem_local;
  char *path_local;
  assetsys_t *sys_local;
  
  if (path == (char *)0x0) {
    sys_local._4_4_ = ASSETSYS_ERROR_INVALID_PARAMETER;
  }
  else if (mount_as == (char *)0x0) {
    sys_local._4_4_ = ASSETSYS_ERROR_INVALID_PARAMETER;
  }
  else {
    pcVar6 = strchr(path,0x5c);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = strchr(mount_as,0x3a);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = strchr(mount_as,0x5c);
        if (pcVar6 == (char *)0x0) {
          sVar7 = strlen(path);
          iVar2 = (int)sVar7;
          if ((iVar2 < 1) || (*path != '/')) {
            if ((iVar2 < 2) || (path[iVar2 + -1] != '/')) {
              sVar7 = strlen(mount_as);
              iVar2 = (int)sVar7;
              if (((iVar2 == 0) || (*mount_as != '/')) ||
                 ((1 < iVar2 && (mount_as[iVar2 + -1] == '/')))) {
                sys_local._4_4_ = ASSETSYS_ERROR_INVALID_PATH;
              }
              else {
                if (zip_mem == (char *)0x0) {
                  local_7b0 = path;
                  if (*path == '\0') {
                    local_7b0 = ".";
                  }
                  iVar2 = ::stat(local_7b0,(stat *)local_d8);
                  if (iVar2 != 0) {
                    return ASSETSYS_ERROR_INVALID_PATH;
                  }
                  if (((uint)s.st_nlink & 0x4000) == 0) {
                    if (((uint)s.st_nlink & 0x8000) == 0) {
                      return ASSETSYS_ERROR_INVALID_PATH;
                    }
                    s.__glibc_reserved[2]._4_4_ = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
                  }
                  else {
                    s.__glibc_reserved[2]._4_4_ = ASSETSYS_INTERNAL_MOUNT_TYPE_DIR;
                  }
                }
                else {
                  s.__glibc_reserved[2]._4_4_ = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
                }
                if (sys->mounts_capacity <= sys->mounts_count) {
                  sys->mounts_capacity = sys->mounts_capacity << 1;
                  paVar8 = (assetsys_internal_mount_t *)malloc((long)sys->mounts_capacity * 0x98);
                  memcpy(paVar8,sys->mounts,(long)sys->mounts_count * 0x98);
                  free(sys->mounts);
                  sys->mounts = paVar8;
                }
                paVar8 = sys->mounts + sys->mounts_count;
                local_7c0 = mount_as;
                if (mount_as == (char *)0x0) {
                  local_7c0 = "";
                }
                uVar9 = assetsys_internal_add_string(sys,local_7c0);
                paVar8->mounted_as = uVar9;
                if (mount_as == (char *)0x0) {
                  local_7c4 = 0;
                }
                else {
                  sVar7 = strlen(mount_as);
                  local_7c4 = (int)sVar7;
                }
                paVar8->mount_len = local_7c4;
                uVar9 = assetsys_internal_add_string(sys,path);
                paVar8->path = uVar9;
                paVar8->type = s.__glibc_reserved[2]._4_4_;
                paVar8->files_count = 0;
                paVar8->files_capacity = 0x1000;
                paVar10 = (assetsys_internal_file_t *)malloc((long)paVar8->files_capacity * 0xc);
                paVar8->files = paVar10;
                paVar8->dirs_count = 0;
                paVar8->dirs_capacity = 0x400;
                paVar11 = (assetsys_internal_folder_t *)malloc((long)paVar8->dirs_capacity << 2);
                paVar8->dirs = paVar11;
                paVar11 = paVar8->dirs;
                iVar2 = paVar8->dirs_count;
                paVar8->dirs_count = iVar2 + 1;
                iVar3 = assetsys_internal_register_collated(sys,mount_as,0);
                paVar11[iVar2].collated_index = iVar3;
                if (s.__glibc_reserved[2]._4_4_ == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR) {
                  assetsys_internal_recurse_directories(sys,paVar11[iVar2].collated_index,paVar8);
                }
                else if (s.__glibc_reserved[2]._4_4_ == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP) {
                  memset(&paVar8->zip,0,0x60);
                  (paVar8->zip).m_pAlloc = assetsys_internal_mz_alloc;
                  (paVar8->zip).m_pRealloc = assetsys_internal_mz_realloc;
                  (paVar8->zip).m_pFree = assetsys_internal_mz_free;
                  (paVar8->zip).m_pAlloc_opaque = sys->memctx;
                  mVar4 = mz_zip_reader_init_mem(&paVar8->zip,zip_mem,zip_mem_size,0);
                  if (mVar4 == 0) {
                    free(paVar8->dirs);
                    free(paVar8->files);
                    return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
                  }
                  mVar5 = mz_zip_reader_get_num_files(&paVar8->zip);
                  for (new_dirs._4_4_ = 0; (int)new_dirs._4_4_ < (int)mVar5;
                      new_dirs._4_4_ = new_dirs._4_4_ + 1) {
                    mVar4 = mz_zip_reader_is_file_a_directory(&paVar8->zip,new_dirs._4_4_);
                    if (mVar4 != 0) {
                      if (paVar8->dirs_capacity <= paVar8->dirs_count) {
                        paVar8->dirs_capacity = paVar8->dirs_capacity << 1;
                        paVar11 = (assetsys_internal_folder_t *)
                                  malloc((long)paVar8->dirs_capacity << 2);
                        memcpy(paVar11,paVar8->dirs,(long)paVar8->dirs_count << 2);
                        free(paVar8->dirs);
                        paVar8->dirs = paVar11;
                      }
                      mz_zip_reader_get_filename(&paVar8->zip,new_dirs._4_4_,(char *)&as_dir,0x400);
                      paVar11 = paVar8->dirs;
                      iVar2 = paVar8->dirs_count;
                      paVar8->dirs_count = iVar2 + 1;
                      pcVar6 = assetsys_internal_get_string(sys,paVar8->mounted_as);
                      strcpy(sys->temp,pcVar6);
                      strcat(sys->temp,"/");
                      strcat(sys->temp,(char *)&as_dir);
                      sVar7 = strlen(sys->temp);
                      sys->temp[sVar7 - 1] = '\0';
                      iVar3 = assetsys_internal_register_collated(sys,sys->temp,0);
                      paVar11[iVar2].collated_index = iVar3;
                    }
                  }
                  for (new_files._4_4_ = 0; (int)new_files._4_4_ < (int)mVar5;
                      new_files._4_4_ = new_files._4_4_ + 1) {
                    mVar4 = mz_zip_reader_is_file_a_directory(&paVar8->zip,new_files._4_4_);
                    if (mVar4 == 0) {
                      if (paVar8->files_capacity <= paVar8->files_count) {
                        paVar8->files_capacity = paVar8->files_capacity << 1;
                        stat.m_comment._248_8_ = malloc((long)paVar8->files_capacity * 0xc);
                        memcpy((void *)stat.m_comment._248_8_,paVar8->files,
                               (long)paVar8->files_count * 0xc);
                        free(paVar8->files);
                        paVar8->files = (assetsys_internal_file_t *)stat.m_comment._248_8_;
                      }
                      mVar4 = mz_zip_reader_file_stat
                                        (&paVar8->zip,new_files._4_4_,
                                         (mz_zip_archive_file_stat *)local_778);
                      if (mVar4 == 0) {
                        mz_zip_reader_end(&paVar8->zip);
                        free(paVar8->dirs);
                        free(paVar8->files);
                        return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
                      }
                      iVar2 = paVar8->files_count;
                      paVar8->files_count = iVar2 + 1;
                      paVar10 = paVar8->files + iVar2;
                      pcVar6 = assetsys_internal_get_string(sys,paVar8->mounted_as);
                      strcpy(sys->temp,pcVar6);
                      strcat(sys->temp,"/");
                      strcat(sys->temp,(char *)((long)&stat.m_local_header_ofs + 4));
                      iVar2 = assetsys_internal_register_collated(sys,sys->temp,1);
                      paVar10->collated_index = iVar2;
                      paVar10->size = (int)stat.m_comp_size;
                      paVar10->zip_index = new_files._4_4_;
                      pcVar6 = assetsys_internal_dirname(sys->temp);
                      sVar7 = strlen(pcVar6);
                      uVar9 = strpool_inject(&sys->strpool,pcVar6,(int)sVar7 + -1);
                      bVar1 = false;
                      for (as_dir_1._0_4_ = 0; (int)as_dir_1 < paVar8->dirs_count;
                          as_dir_1._0_4_ = (int)as_dir_1 + 1) {
                        if (uVar9 == sys->collated[paVar8->dirs[(int)as_dir_1].collated_index].path)
                        {
                          bVar1 = true;
                        }
                      }
                      if (!bVar1) {
                        paVar11 = paVar8->dirs;
                        iVar2 = paVar8->dirs_count;
                        paVar8->dirs_count = iVar2 + 1;
                        pcVar6 = assetsys_internal_get_string(sys,uVar9);
                        iVar3 = assetsys_internal_register_collated(sys,pcVar6,0);
                        paVar11[iVar2].collated_index = iVar3;
                      }
                    }
                  }
                }
                assetsys_internal_collate_directories(sys,paVar8);
                sys->mounts_count = sys->mounts_count + 1;
                sys_local._4_4_ = ASSETSYS_SUCCESS;
              }
            }
            else {
              sys_local._4_4_ = ASSETSYS_ERROR_INVALID_PATH;
            }
          }
          else {
            sys_local._4_4_ = ASSETSYS_ERROR_INVALID_PATH;
          }
        }
        else {
          sys_local._4_4_ = ASSETSYS_ERROR_INVALID_PATH;
        }
      }
      else {
        sys_local._4_4_ = ASSETSYS_ERROR_INVALID_PATH;
      }
    }
    else {
      sys_local._4_4_ = ASSETSYS_ERROR_INVALID_PATH;
    }
  }
  return sys_local._4_4_;
}

Assistant:

assetsys_error_t assetsys_mount( assetsys_t* sys, char const* path, const char *zip_mem, size_t zip_mem_size, char const* mount_as )
    {
    if( !path ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( !mount_as ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( strchr( path, '\\' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    if( strchr( mount_as, ':' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    if( strchr( mount_as, '\\' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    int len = (int) strlen( path );
    if( len > 0 && path[ 0 ] == '/' ) return ASSETSYS_ERROR_INVALID_PATH;       
    if( len > 1 && path[ len - 1 ] == '/' ) return ASSETSYS_ERROR_INVALID_PATH;     
    int mount_len = (int) strlen( mount_as );
    if( mount_len == 0 || mount_as[ 0 ] != '/' || ( mount_len > 1 && mount_as[ mount_len - 1 ] == '/' ) ) 
        return ASSETSYS_ERROR_INVALID_PATH;     
    
    enum assetsys_internal_mount_type_t type;

    if (!zip_mem) 
    {
    #if defined( _MSC_VER ) && _MSC_VER >= 1400
        struct _stat64 s;
        int res = __stat64( *path == '\0' ? "." : path, &s );
    #else
        struct stat s;
        int res = stat( *path == '\0' ? "." : path, &s );
    #endif
    if( res == 0 )
        {
        if( s.st_mode & S_IFDIR ) type = ASSETSYS_INTERNAL_MOUNT_TYPE_DIR;
        else if( s.st_mode & S_IFREG ) type = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
        else return ASSETSYS_ERROR_INVALID_PATH;
        }
    else
        {
        return ASSETSYS_ERROR_INVALID_PATH;
        }
    }
    else 
    {
        type = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
    }

    if( sys->mounts_count >= sys->mounts_capacity )
        {
        sys->mounts_capacity *= 2;
        struct assetsys_internal_mount_t* new_mounts = (struct assetsys_internal_mount_t*) ASSETSYS_MALLOC( sys->memctx, 
            sizeof( *sys->mounts ) * sys->mounts_capacity );
        memcpy( new_mounts, sys->mounts, sizeof( *sys->mounts ) * sys->mounts_count );
        ASSETSYS_FREE( sys->memctx, sys->mounts );
        sys->mounts = new_mounts;
        }

    struct assetsys_internal_mount_t* mount = &sys->mounts[ sys->mounts_count ];

    mount->mounted_as = assetsys_internal_add_string( sys, mount_as ? mount_as : "" );
    mount->mount_len = mount_as ? (int) strlen( mount_as ) : 0;
    mount->path = assetsys_internal_add_string( sys, path );
    mount->type = type;
        
    mount->files_count = 0;
    mount->files_capacity = 4096;
    mount->files = (struct assetsys_internal_file_t*) ASSETSYS_MALLOC( sys->memctx, 
        sizeof( *(mount->files) ) * mount->files_capacity );

    mount->dirs_count = 0;
    mount->dirs_capacity = 1024;
    mount->dirs = (struct assetsys_internal_folder_t*) ASSETSYS_MALLOC( sys->memctx, 
        sizeof( *(mount->dirs) ) * mount->dirs_capacity );

    struct assetsys_internal_folder_t* dir = &mount->dirs[ mount->dirs_count++ ];
    dir->collated_index = assetsys_internal_register_collated( sys, mount_as, 0 );
    
    if( type == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR )
        {
        assetsys_internal_recurse_directories( sys, dir->collated_index, mount );
        }
    else if( type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP )
        {
        memset( &mount->zip, 0, sizeof( mount->zip ) );
        mount->zip.m_pAlloc = assetsys_internal_mz_alloc;
        mount->zip.m_pRealloc = assetsys_internal_mz_realloc;
        mount->zip.m_pFree = assetsys_internal_mz_free;
        mount->zip.m_pAlloc_opaque = sys->memctx;
        //mz_bool status = mz_zip_reader_init_file( &mount->zip, path, 0 );
        mz_bool status = mz_zip_reader_init_mem( &mount->zip, zip_mem, zip_mem_size, 0 );
        if( !status )
            {
            ASSETSYS_FREE( sys->memctx, mount->dirs );
            ASSETSYS_FREE( sys->memctx, mount->files );
            return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
            }

        int count = (int) mz_zip_reader_get_num_files( &mount->zip );

        for( int i = 0; i < count; ++i )
            {
            if( mz_zip_reader_is_file_a_directory( &mount->zip, (mz_uint) i ) )
                {
                if( mount->dirs_count >= mount->dirs_capacity )
                    {
                    mount->dirs_capacity *= 2;
                    struct assetsys_internal_folder_t* new_dirs = (struct assetsys_internal_folder_t*) ASSETSYS_MALLOC( 
                        sys->memctx, sizeof( *(mount->dirs) ) * mount->dirs_capacity );
                    memcpy( new_dirs, mount->dirs, sizeof( *(mount->dirs) ) * mount->dirs_count );
                    ASSETSYS_FREE( sys->memctx, mount->dirs );
                    mount->dirs = new_dirs;
                    }

                char filename[ 1024 ];                
                mz_zip_reader_get_filename( &mount->zip, (mz_uint) i, filename, sizeof( filename ) );

                struct assetsys_internal_folder_t* as_dir = &mount->dirs[ mount->dirs_count++ ];
                strcpy( sys->temp, assetsys_internal_get_string( sys, mount->mounted_as ) );
                strcat( sys->temp, "/" );
                strcat( sys->temp, filename );
                sys->temp[ strlen( sys->temp )  - 1 ] = '\0';
                as_dir->collated_index = assetsys_internal_register_collated( sys, sys->temp, 0 );
                }
            }

        for( int i = 0; i < count; ++i )
            {
            if( !mz_zip_reader_is_file_a_directory( &mount->zip, (mz_uint) i ) )
                {
                if( mount->files_count >= mount->files_capacity )
                    {
                    mount->files_capacity *= 2;
                    struct assetsys_internal_file_t* new_files = (struct assetsys_internal_file_t*) ASSETSYS_MALLOC( 
                        sys->memctx, sizeof( *(mount->files) ) * mount->files_capacity );
                    memcpy( new_files, mount->files, sizeof( *(mount->files) ) * mount->files_count );
                    ASSETSYS_FREE( sys->memctx, mount->files );
                    mount->files = new_files;
                    }

                mz_zip_archive_file_stat stat;
                mz_bool result = mz_zip_reader_file_stat( &mount->zip, (mz_uint) i, &stat);
                if( !result )
                    {
                    mz_zip_reader_end( &mount->zip );
                    ASSETSYS_FREE( sys->memctx, mount->dirs );
                    ASSETSYS_FREE( sys->memctx, mount->files );
                    return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
                    }

                struct assetsys_internal_file_t* file = &mount->files[ mount->files_count++ ];
                strcpy( sys->temp, assetsys_internal_get_string( sys, mount->mounted_as ) );
                strcat( sys->temp, "/" );
                strcat( sys->temp, stat.m_filename );
                file->collated_index = assetsys_internal_register_collated( sys, sys->temp, 1 );
                file->size = (int) stat.m_uncomp_size;
                file->zip_index = i;

                char* dir_path = assetsys_internal_dirname( sys->temp );
                ASSETSYS_U64 handle = strpool_inject( &sys->strpool, dir_path, (int) strlen( dir_path ) - 1 );               
                int found = 0;
                for( int j = 0; j < mount->dirs_count; ++j )
                    {
                    if( handle == sys->collated[ mount->dirs[ j ].collated_index ].path )
                        found = 1;
                    }
                if( !found ) 
                    {
                    struct assetsys_internal_folder_t* as_dir = &mount->dirs[ mount->dirs_count++ ];
                    as_dir->collated_index = assetsys_internal_register_collated( sys, 
                        assetsys_internal_get_string( sys, handle ), 0 );
                    }
                }
            }
        }
        

    assetsys_internal_collate_directories( sys, mount );

    ++sys->mounts_count;
    return ASSETSYS_SUCCESS;
    }